

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ParseHelper.cpp
# Opt level: O1

void __thiscall
glslang::TParseContext::growAtomicCounterBlock
          (TParseContext *this,int binding,TSourceLoc *loc,TType *memberType,TString *memberName,
          TTypeList *typeList)

{
  _Rb_tree_header *p_Var1;
  TIntermediate *this_00;
  int iVar2;
  TBlockStorageClass newBacking;
  _Base_ptr p_Var3;
  mapped_type *ppTVar4;
  undefined4 extraout_var;
  TQualifier *this_01;
  undefined4 extraout_var_00;
  undefined4 extraout_var_01;
  _Base_ptr p_Var5;
  int local_3c;
  TSourceLoc *local_38;
  
  p_Var1 = &(this->super_TParseContextBase).atomicCounterBuffers.
            super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
            ._M_t._M_impl.super__Rb_tree_header;
  p_Var5 = (this->super_TParseContextBase).atomicCounterBuffers.
           super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
           ._M_t._M_impl.super__Rb_tree_header._M_header._M_parent;
  p_Var3 = &p_Var1->_M_header;
  for (; p_Var5 != (_Base_ptr)0x0; p_Var5 = (&p_Var5->_M_left)[(int)p_Var5[1]._M_color < binding]) {
    if (binding <= (int)p_Var5[1]._M_color) {
      p_Var3 = p_Var5;
    }
  }
  p_Var5 = &p_Var1->_M_header;
  if (((_Rb_tree_header *)p_Var3 != p_Var1) && (p_Var5 = p_Var3, binding < (int)p_Var3[1]._M_color))
  {
    p_Var5 = &p_Var1->_M_header;
  }
  if ((_Rb_tree_header *)p_Var5 == p_Var1) {
    (this->super_TParseContextBase).atomicCounterBlockSet =
         ((this->super_TParseContextBase).super_TParseVersions.intermediate)->atomicCounterBlockSet;
  }
  local_3c = binding;
  local_38 = loc;
  TParseContextBase::growAtomicCounterBlock
            (&this->super_TParseContextBase,binding,loc,memberType,memberName,typeList);
  ppTVar4 = std::
            map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
            ::operator[](&(this->super_TParseContextBase).atomicCounterBuffers.
                          super_map<int,_glslang::TVariable_*,_std::less<int>,_glslang::pool_allocator<std::pair<const_int,_glslang::TVariable_*>_>_>
                         ,&local_3c);
  iVar2 = (*((*ppTVar4)->super_TSymbol)._vptr_TSymbol[0xd])();
  this_01 = (TQualifier *)
            (**(code **)(*(long *)CONCAT44(extraout_var,iVar2) + 0x50))
                      ((long *)CONCAT44(extraout_var,iVar2));
  this_01->field_0xc = this_01->field_0xc | 8;
  if ((0 < (this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkan) &&
     ((this->super_TParseContextBase).super_TParseVersions.spvVersion.vulkanRelaxed == true)) {
    this_00 = (this->super_TParseContextBase).super_TParseVersions.intermediate;
    iVar2 = (*(this->super_TParseContextBase).super_TParseVersions._vptr_TParseVersions[0x48])(this)
    ;
    newBacking = TIntermediate::getBlockStorageOverride
                           (this_00,(char *)CONCAT44(extraout_var_00,iVar2));
    if (newBacking != EbsNone) {
      if ((_Rb_tree_header *)p_Var5 == p_Var1) {
        TQualifier::setBlockStorage(this_01,newBacking);
        blockQualifierCheck(this,local_38,this_01,false);
      }
      iVar2 = (*memberType->_vptr_TType[10])(memberType);
      TQualifier::setBlockStorage((TQualifier *)CONCAT44(extraout_var_01,iVar2),newBacking);
    }
  }
  return;
}

Assistant:

void TParseContext::growAtomicCounterBlock(int binding, const TSourceLoc& loc, TType& memberType, const TString& memberName, TTypeList* typeList)
{
    bool createBlock = atomicCounterBuffers.find(binding) == atomicCounterBuffers.end();

    if (createBlock) {
        atomicCounterBlockSet = intermediate.getAtomicCounterBlockSet();
    }

    // use base class function to create/expand block
    TParseContextBase::growAtomicCounterBlock(binding, loc, memberType, memberName, typeList);
    TQualifier& qualifier = atomicCounterBuffers[binding]->getWritableType().getQualifier();
    qualifier.defaultBlock = true;

    if (spvVersion.vulkan > 0 && spvVersion.vulkanRelaxed) {
        // check for a Block storage override
        TBlockStorageClass storageOverride = intermediate.getBlockStorageOverride(getAtomicCounterBlockName());

        if (storageOverride != EbsNone) {
            if (createBlock) {
                // Remap block storage

                qualifier.setBlockStorage(storageOverride);

                // check that the change didn't create errors
                blockQualifierCheck(loc, qualifier, false);
            }

            // remap meber storage as well
            memberType.getQualifier().setBlockStorage(storageOverride);
        }
    }
}